

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O2

void __thiscall quad::set_bounding_box(quad *this)

{
  double dVar1;
  double dVar2;
  aabb bbox_diagonal2;
  aabb bbox_diagonal1;
  aabb local_d8;
  undefined1 local_a8 [16];
  double local_98;
  aabb local_88;
  aabb local_50;
  
  local_88.y.min = (this->Q).e[2] + (this->u).e[2] + (this->v).e[2];
  dVar1 = (this->v).e[1] + (this->u).e[1] + (this->Q).e[1];
  local_88.x.max._0_4_ = SUB84(dVar1,0);
  local_88.x.min = (this->v).e[0] + (this->u).e[0] + (this->Q).e[0];
  local_88.x.max._4_4_ = (int)((ulong)dVar1 >> 0x20);
  aabb::aabb(&local_50,&this->Q,(point3 *)&local_88);
  local_98 = (this->Q).e[2];
  local_d8.y.min = (this->u).e[2] + local_98;
  dVar2 = (this->Q).e[0];
  dVar1 = (this->Q).e[1];
  local_d8.x.min = (this->u).e[0] + dVar2;
  local_d8.x.max = (this->u).e[1] + dVar1;
  local_98 = local_98 + (this->v).e[2];
  dVar1 = (this->v).e[1] + dVar1;
  local_a8._8_4_ = SUB84(dVar1,0);
  local_a8._0_8_ = (this->v).e[0] + dVar2;
  local_a8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  aabb::aabb(&local_88,(point3 *)&local_d8,(point3 *)local_a8);
  aabb::aabb(&local_d8,&local_50,&local_88);
  (this->bbox).z.min = local_d8.z.min;
  (this->bbox).z.max = local_d8.z.max;
  (this->bbox).y.min = local_d8.y.min;
  (this->bbox).y.max = local_d8.y.max;
  (this->bbox).x.min = local_d8.x.min;
  (this->bbox).x.max = local_d8.x.max;
  return;
}

Assistant:

virtual void set_bounding_box() {
        // Compute the bounding box of all four vertices.
        auto bbox_diagonal1 = aabb(Q, Q + u + v);
        auto bbox_diagonal2 = aabb(Q + u, Q + v);
        bbox = aabb(bbox_diagonal1, bbox_diagonal2);
    }